

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxClassTypeCast::Resolve(FxClassTypeCast *this,FCompileContext *ctx)

{
  PClassPointer *valtype;
  PType *pPVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  MetaClass *pMVar5;
  char *pcVar6;
  char *pcVar7;
  FxNameCast *this_00;
  size_t size;
  FxExpression *x_2;
  PClass *local_70;
  PClass *cls;
  undefined1 local_58 [20];
  undefined1 local_44 [8];
  FName clsname;
  FxExpression *x_1;
  PClassPointer *from;
  PClassPointer *to;
  FxExpression *x;
  FCompileContext *ctx_local;
  FxClassTypeCast *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    if (this->basex != (FxExpression *)0x0) {
      iVar3 = (*this->basex->_vptr_FxExpression[2])();
      this->basex = (FxExpression *)CONCAT44(extraout_var,iVar3);
    }
    if (this->basex == (FxExpression *)0x0) {
      if (this != (FxClassTypeCast *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxClassTypeCast *)0x0;
    }
    else if ((PPointer *)this->basex->ValueType == TypeNullPtr) {
      this->basex->ValueType = (this->super_FxExpression).ValueType;
      this_local = (FxClassTypeCast *)this->basex;
      this->basex = (FxExpression *)0x0;
      if (this != (FxClassTypeCast *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
    }
    else {
      valtype = (PClassPointer *)(this->super_FxExpression).ValueType;
      pMVar5 = PType::GetClass(this->basex->ValueType);
      if (pMVar5 == (MetaClass *)PClassPointer::RegistrationInfo.MyClass) {
        pPVar1 = this->basex->ValueType;
        bVar2 = PClass::IsDescendantOf
                          ((PClass *)pPVar1[1].super_PTypeBase.super_DObject.ObjNext,
                           valtype->ClassRestriction);
        if (bVar2) {
          this->basex->ValueType = (PType *)valtype;
          unique0x00012000 = (PType *)this->basex;
          this->basex = (FxExpression *)0x0;
          if (this != (FxClassTypeCast *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          this_local = (FxClassTypeCast *)stack0xffffffffffffffc0;
        }
        else {
          pcVar6 = FName::GetChars((FName *)(pPVar1[1].super_PTypeBase.super_DObject.ObjNext + 4));
          pcVar7 = FName::GetChars(&(valtype->ClassRestriction->super_PNativeStruct).super_PStruct.
                                    super_PNamedType.TypeName);
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,
                     "Cannot convert from %s to %s: Incompatible class types",pcVar6,pcVar7);
          if (this != (FxClassTypeCast *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          this_local = (FxClassTypeCast *)0x0;
        }
      }
      else if ((this->basex->ValueType == (PType *)TypeName) ||
              (this->basex->ValueType == (PType *)TypeString)) {
        uVar4 = (*this->basex->_vptr_FxExpression[3])();
        if ((uVar4 & 1) == 0) {
          if (this->basex->ValueType == (PType *)TypeString) {
            this_00 = (FxNameCast *)FxExpression::operator_new((FxExpression *)0x30,(size_t)ctx);
            FxNameCast::FxNameCast(this_00,this->basex);
            this->basex = (FxExpression *)this_00;
          }
        }
        else {
          FxConstant::GetValue((FxConstant *)local_58);
          ExpVal::GetName((ExpVal *)local_44);
          ExpVal::~ExpVal((ExpVal *)local_58);
          local_70 = (PClass *)0x0;
          size = 0;
          bVar2 = FName::operator!=((FName *)local_44,NAME_None);
          if (bVar2) {
            FName::FName((FName *)((long)&x_2 + 4),(FName *)local_44);
            local_70 = PClass::FindClass((FName *)((long)&x_2 + 4));
            if (local_70 == (PClass *)0x0) {
              pcVar6 = FName::GetChars((FName *)local_44);
              pcVar7 = FName::GetChars(&(this->desttype->super_PNativeStruct).super_PStruct.
                                        super_PNamedType.TypeName);
              size = 3;
              FScriptPosition::Message
                        (&(this->super_FxExpression).ScriptPosition,3,
                         "Unknown class name \'%s\' of type \'%s\'",pcVar6,pcVar7);
            }
            else {
              bVar2 = PClass::IsDescendantOf(local_70,this->desttype);
              if (bVar2) {
                pcVar6 = FName::GetChars((FName *)local_44);
                size = 8;
                FScriptPosition::Message
                          (&(this->super_FxExpression).ScriptPosition,8,
                           "resolving \'%s\' as class name",pcVar6);
              }
              else {
                pcVar6 = FName::GetChars((FName *)local_44);
                pcVar7 = FName::GetChars(&(this->desttype->super_PNativeStruct).super_PStruct.
                                          super_PNamedType.TypeName);
                size = 3;
                FScriptPosition::Message
                          (&(this->super_FxExpression).ScriptPosition,3,
                           "class \'%s\' is not compatible with \'%s\'",pcVar6,pcVar7);
                local_70 = (PClass *)0x0;
              }
            }
          }
          this_local = (FxClassTypeCast *)FxExpression::operator_new((FxExpression *)0x38,size);
          FxConstant::FxConstant
                    ((FxConstant *)this_local,local_70,valtype,
                     &(this->super_FxExpression).ScriptPosition);
          if (this != (FxClassTypeCast *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
        }
      }
      else {
        pcVar6 = PType::DescriptiveName(this->basex->ValueType);
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Cannot convert %s to class type",
                   pcVar6);
        if (this != (FxClassTypeCast *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        this_local = (FxClassTypeCast *)0x0;
      }
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxClassTypeCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType == TypeNullPtr)
	{
		basex->ValueType = ValueType;
		auto x = basex;
		basex = nullptr;
		delete this;
		return x;
	}
	auto to = static_cast<PClassPointer *>(ValueType);
	if (basex->ValueType->GetClass() == RUNTIME_CLASS(PClassPointer))
	{
		auto from = static_cast<PClassPointer *>(basex->ValueType);
		if (from->ClassRestriction->IsDescendantOf(to->ClassRestriction))
		{
			basex->ValueType = to;
			auto x = basex;
			basex = nullptr;
			delete this;
			return x;
		}
		ScriptPosition.Message(MSG_ERROR, "Cannot convert from %s to %s: Incompatible class types", from->ClassRestriction->TypeName.GetChars(), to->ClassRestriction->TypeName.GetChars());
		delete this;
		return nullptr;
	}
	
	if (basex->ValueType != TypeName && basex->ValueType != TypeString)
	{
		ScriptPosition.Message(MSG_ERROR, "Cannot convert %s to class type", basex->ValueType->DescriptiveName());
		delete this;
		return nullptr;
	}

	if (basex->isConstant())
	{
		FName clsname = static_cast<FxConstant *>(basex)->GetValue().GetName();
		PClass *cls = nullptr;

		if (clsname != NAME_None)
		{
			cls = PClass::FindClass(clsname);
			if (cls == nullptr)
			{
				/* lax */
				// Since this happens in released WADs it must pass without a terminal error... :(
				ScriptPosition.Message(MSG_OPTERROR,
					"Unknown class name '%s' of type '%s'",
					clsname.GetChars(), desttype->TypeName.GetChars());
			}
			else
			{
				if (!cls->IsDescendantOf(desttype))
				{
					ScriptPosition.Message(MSG_OPTERROR, "class '%s' is not compatible with '%s'", clsname.GetChars(), desttype->TypeName.GetChars());
					cls = nullptr;
				}
				else ScriptPosition.Message(MSG_DEBUGLOG, "resolving '%s' as class name", clsname.GetChars());
			}
		}
		FxExpression *x = new FxConstant(cls, to, ScriptPosition);
		delete this;
		return x;
	}
	if (basex->ValueType == TypeString)
	{
		basex = new FxNameCast(basex);
	}
	return this;
}